

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTFWrapper.cpp
# Opt level: O0

bool __thiscall llvm::ConvertUTF8toWide(llvm *this,StringRef Source,wstring *Result)

{
  StringRef Source_00;
  bool bVar1;
  wstring *Result_local;
  StringRef Source_local;
  
  Source_00.Length = (size_t)Source.Data;
  Source_00.Data = (char *)this;
  bVar1 = ConvertUTF8toWideInternal<std::__cxx11::wstring>
                    (Source_00,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     Source.Length);
  return bVar1;
}

Assistant:

bool ConvertUTF8toWide(llvm::StringRef Source, std::wstring &Result) {
  return ConvertUTF8toWideInternal(Source, Result);
}